

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# priorbox.cpp
# Opt level: O0

void __thiscall ncnn::PriorBox::PriorBox(PriorBox *this)

{
  undefined8 *in_RDI;
  Layer *in_stack_ffffffffffffffd0;
  
  Layer::Layer(in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__PriorBox_009b5fc0;
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x1a));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x23));
  ncnn::Mat::Mat((Mat *)(in_RDI + 0x2c));
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)((long)in_RDI + 9) = 0;
  return;
}

Assistant:

PriorBox::PriorBox()
{
    one_blob_only = false;
    support_inplace = false;
}